

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O2

void CMU462::Collada::ColladaParser::parse_camera(XMLElement *xml,CameraInfo *camera)

{
  double dVar1;
  undefined8 uVar2;
  XMLElement *pXVar3;
  XMLElement *this;
  XMLElement *this_00;
  XMLElement *this_01;
  XMLElement *this_02;
  char *pcVar4;
  float fVar5;
  allocator local_75;
  float local_74;
  string local_70;
  string local_50;
  
  tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  std::__cxx11::string::assign((char *)&(camera->super_Instance).id);
  tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  std::__cxx11::string::assign((char *)&(camera->super_Instance).name);
  (camera->super_Instance).type = CAMERA;
  uVar2 = up._8_8_;
  (camera->up_dir).x = (double)up._0_8_;
  (camera->up_dir).y = (double)uVar2;
  (camera->up_dir).z = (double)up._16_8_;
  (camera->view_dir).x = 0.0;
  (camera->view_dir).y = 0.0;
  (camera->view_dir).z = -1.0;
  std::__cxx11::string::string((string *)&local_50,"optics/technique_common/perspective",&local_75);
  pXVar3 = get_element(xml,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (pXVar3 != (XMLElement *)0x0) {
    this = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"xfov");
    this_00 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"yfov");
    this_01 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"znear");
    this_02 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"zfar");
    if (this == (XMLElement *)0x0) {
      fVar5 = 50.0;
    }
    else {
      pcVar4 = tinyxml2::XMLElement::GetText(this);
      dVar1 = atof(pcVar4);
      fVar5 = (float)dVar1;
    }
    camera->hFov = fVar5;
    if (this_00 == (XMLElement *)0x0) {
      fVar5 = 35.0;
    }
    else {
      pcVar4 = tinyxml2::XMLElement::GetText(this_00);
      dVar1 = atof(pcVar4);
      fVar5 = (float)dVar1;
    }
    camera->vFov = fVar5;
    if (this_01 == (XMLElement *)0x0) {
      fVar5 = 0.001;
    }
    else {
      pcVar4 = tinyxml2::XMLElement::GetText(this_01);
      dVar1 = atof(pcVar4);
      fVar5 = (float)dVar1;
    }
    camera->nClip = fVar5;
    if (this_02 == (XMLElement *)0x0) {
      fVar5 = 1000.0;
    }
    else {
      pcVar4 = tinyxml2::XMLElement::GetText(this_02);
      dVar1 = atof(pcVar4);
      fVar5 = (float)dVar1;
    }
    camera->fClip = fVar5;
    if (this_00 == (XMLElement *)0x0) {
      std::__cxx11::string::string((string *)&local_70,"aspect_ratio",&local_75);
      pXVar3 = get_element(pXVar3,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (pXVar3 == (XMLElement *)0x0) goto LAB_0017675d;
      pcVar4 = tinyxml2::XMLElement::GetText(pXVar3);
      dVar1 = atof(pcVar4);
      local_74 = (float)dVar1;
      dVar1 = tan((double)camera->hFov * 0.5 * 0.017453292519943295);
      dVar1 = atan(dVar1 / (double)local_74);
      camera->vFov = (float)(dVar1 * 57.29577951308232 + dVar1 * 57.29577951308232);
    }
    return;
  }
LAB_0017675d:
  exit(1);
}

Assistant:

void ColladaParser::parse_camera(XMLElement* xml, CameraInfo& camera) {
  // name & id
  camera.id = xml->Attribute("id");
  camera.name = xml->Attribute("name");
  camera.type = Instance::CAMERA;

  // default look direction is down the up axis
  camera.up_dir = up;
  camera.view_dir = Vector3D(0, 0, -1);

  // NOTE (sky): only supports perspective for now
  XMLElement* e_perspective =
      get_element(xml, "optics/technique_common/perspective");
  if (e_perspective) {
    XMLElement* e_xfov = e_perspective->FirstChildElement("xfov");
    XMLElement* e_yfov = e_perspective->FirstChildElement("yfov");
    XMLElement* e_znear = e_perspective->FirstChildElement("znear");
    XMLElement* e_zfar = e_perspective->FirstChildElement("zfar");

    camera.hFov = e_xfov ? atof(e_xfov->GetText()) : 50.0f;
    camera.vFov = e_yfov ? atof(e_yfov->GetText()) : 35.0f;
    camera.nClip = e_znear ? atof(e_znear->GetText()) : 0.001f;
    camera.fClip = e_zfar ? atof(e_zfar->GetText()) : 1000.0f;

    if (!e_yfov) {  // if vfov is not given, compute from aspect ratio
      XMLElement* e_aspect_ratio = get_element(e_perspective, "aspect_ratio");
      if (e_aspect_ratio) {
        float aspect_ratio = atof(e_aspect_ratio->GetText());
        camera.vFov =
            2 * degrees(atan(tan(radians(0.5 * camera.hFov)) / aspect_ratio));
      } else {
        stat("Error: incomplete perspective definition in: " << camera.id);
        exit(EXIT_FAILURE);
      }
    }
  } else {
    stat("Error: no perspective defined in camera: " << camera.id);
    exit(EXIT_FAILURE);
  }

  // print summary
  stat("  |- " << camera);
}